

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiPlayerDialog.cpp
# Opt level: O3

void __thiscall MidiPlayerDialog::on_addListButton_clicked(MidiPlayerDialog *this)

{
  int *piVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char cVar6;
  undefined4 uVar7;
  uint uVar8;
  int iVar9;
  Master *this_00;
  QSettings *pQVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QFile listFile;
  QString s;
  QString fileName;
  QTextStream listStream;
  QString local_98;
  anon_union_24_3_e3d07ef4_for_data local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  qsizetype local_28;
  
  this_00 = Master::getInstance();
  pQVar10 = Master::getSettings(this_00);
  if (on_addListButton_clicked()::currentDir == '\0') {
    iVar9 = __cxa_guard_acquire(&on_addListButton_clicked()::currentDir);
    if (iVar9 != 0) {
      QString::QString(&local_98,"Master/LastAddMidiFileListDir");
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = 0;
      local_58._16_8_ = 0;
      local_40 = 2;
      QSettings::value((QString *)local_78.data,(QVariant *)pQVar10);
      QVariant::toString();
      QVariant::~QVariant((QVariant *)&local_78);
      QVariant::~QVariant((QVariant *)&local_58);
      if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,8);
        }
      }
      __cxa_atexit(QString::~QString,&on_addListButton_clicked::currentDir,&__dso_handle);
      __cxa_guard_release(&on_addListButton_clicked()::currentDir);
    }
  }
  QVar11.m_data = (storage_type *)0x19;
  QVar11.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar11);
  local_98.d.d = (Data *)local_58.shared;
  local_98.d.ptr = (char16_t *)local_58._8_8_;
  local_98.d.size = local_58._16_8_;
  QVariant::QVariant((QVariant *)&local_58,0);
  QSettings::value((QString *)local_78.data,(QVariant *)pQVar10);
  uVar7 = QVariant::toInt((bool *)local_78.data);
  QVariant::~QVariant((QVariant *)&local_78);
  QVariant::~QVariant((QVariant *)&local_58);
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,8);
    }
  }
  QVar12.m_data = (storage_type *)0x0;
  QVar12.m_size = (qsizetype)&local_78;
  QString::fromUtf8(QVar12);
  local_98.d.d = (Data *)local_78.shared;
  local_98.d.ptr = (char16_t *)local_78._8_8_;
  local_98.d.size = local_78._16_8_;
  QVar13.m_data = (storage_type *)0x15;
  QVar13.m_size = (qsizetype)&local_78;
  QString::fromUtf8(QVar13);
  local_38 = local_78._0_4_;
  uStack_34 = local_78._4_4_;
  uStack_30 = local_78._8_4_;
  uStack_2c = local_78._12_4_;
  local_28 = local_78._16_8_;
  QFileDialog::getOpenFileName
            (&local_58,this,&local_98,&on_addListButton_clicked::currentDir,&local_38,0,uVar7);
  piVar1 = (int *)CONCAT44(uStack_34,local_38);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_34,local_38),2,8);
    }
  }
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,8);
    }
  }
  if (local_58._16_8_ != 0) {
    QDir::QDir((QDir *)&local_98,(QString *)local_58.data);
    QDir::absolutePath();
    uVar5 = local_78._16_8_;
    uVar4 = local_78._0_8_;
    pcVar3 = on_addListButton_clicked::currentDir.d.ptr;
    pDVar2 = on_addListButton_clicked::currentDir.d.d;
    local_78.shared = (PrivateShared *)on_addListButton_clicked::currentDir.d.d;
    on_addListButton_clicked::currentDir.d.d = (Data *)uVar4;
    on_addListButton_clicked::currentDir.d.ptr = (char16_t *)local_78._8_8_;
    local_78._8_8_ = pcVar3;
    local_78._16_8_ = on_addListButton_clicked::currentDir.d.size;
    on_addListButton_clicked::currentDir.d.size = uVar5;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar2->super_QArrayData,2,8);
      }
    }
    QDir::~QDir((QDir *)&local_98);
    QVar14.m_data = (storage_type *)0x1d;
    QVar14.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar14);
    local_98.d.d = (Data *)local_78.shared;
    local_98.d.ptr = (char16_t *)local_78._8_8_;
    local_98.d.size = local_78._16_8_;
    QVariant::QVariant((QVariant *)&local_78,(QString *)&on_addListButton_clicked::currentDir);
    QSettings::setValue((QString *)pQVar10,(QVariant *)&local_98);
    QVariant::~QVariant((QVariant *)&local_78);
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,8);
      }
    }
    QFile::QFile((QFile *)&local_98,(QString *)local_58.data);
    cVar6 = QFile::open(&local_98,1);
    if (cVar6 != '\0') {
      QTextStream::QTextStream((QTextStream *)&local_38,(QIODevice *)&local_98);
      uVar8 = QListWidget::currentRow();
      while( true ) {
        cVar6 = QTextStream::atEnd();
        if (cVar6 != '\0') break;
        QTextStream::readLine((longlong)&local_78);
        if (local_78._16_8_ != 0) {
          uVar8 = uVar8 + 1;
          QListWidget::insertItem((int)*(undefined8 *)(this->ui + 0x18),(QString *)(ulong)uVar8);
        }
        if ((QArrayData *)local_78.shared != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_78.shared = *(int *)local_78.shared + -1;
          UNLOCK();
          if (*(int *)local_78.shared == 0) {
            QArrayData::deallocate((QArrayData *)local_78.shared,2,8);
          }
        }
      }
      QListWidget::setCurrentRow((int)*(undefined8 *)(this->ui + 0x18));
      updateCurrentItem(this);
      QTextStream::~QTextStream((QTextStream *)&local_38);
    }
    QFile::~QFile((QFile *)&local_98);
  }
  if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58.shared = *(int *)local_58.shared + -1;
    UNLOCK();
    if (*(int *)local_58.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_58.shared,2,8);
    }
  }
  return;
}

Assistant:

void MidiPlayerDialog::on_addListButton_clicked() {
	QSettings *settings = Master::getInstance()->getSettings();
	static QString currentDir = settings->value("Master/LastAddMidiFileListDir").toString();
	QFileDialog::Options qFileDialogOptions = QFileDialog::Options(settings->value("Master/qFileDialogOptions", 0).toInt());
	QString fileName = QFileDialog::getOpenFileName(this, NULL, currentDir, "Play list files (*.*)",
		NULL, qFileDialogOptions);
	if (fileName.isEmpty()) return;
	currentDir = QDir(fileName).absolutePath();
	settings->setValue("Master/LastAddMidiFileListDir", currentDir);
	QFile listFile(fileName);
	if (!listFile.open(QIODevice::ReadOnly)) return;
	QTextStream listStream(&listFile);
	int row = ui->playList->currentRow();
	while (!listStream.atEnd()) {
		QString s = listStream.readLine();
		if (s.isEmpty()) continue;
		ui->playList->insertItem(++row, s);
	}
	ui->playList->setCurrentRow(row);
	updateCurrentItem();
}